

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  Size **ppSVar2;
  long *plVar3;
  Size *pSVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  int threshold;
  _InputArray local_3b8;
  undefined8 uStack_3a0;
  Mat origImage1;
  long local_388 [10];
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> featurePoints2;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> featurePoints1;
  _InputArray local_2f8;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> dMatch;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPoint2;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPoint1;
  vector<Descriptor,_std::allocator<Descriptor>_> keyPointDescriptor2;
  vector<Descriptor,_std::allocator<Descriptor>_> keyPointDescriptor1;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_238;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_220;
  void *local_208;
  undefined8 uStack_200;
  long local_1f8;
  _InputArray local_1e8;
  undefined8 uStack_1d0;
  String fileName2;
  String fileName1;
  Mat out;
  long local_178 [11];
  Mat origImage2;
  Mat featurePointsImg;
  _InputOutputArray local_60;
  _InputArray local_48;
  
  std::__cxx11::string::string((string *)&fileName1,argv[1],(allocator *)&origImage1);
  std::__cxx11::string::string((string *)&fileName2,argv[2],(allocator *)&origImage1);
  std::__cxx11::string::string((string *)&origImage1,argv[3],(allocator *)&featurePointsImg);
  plVar3 = _origImage1;
  pSVar4 = (Size *)__errno_location();
  iVar1 = pSVar4->width;
  pSVar4->width = 0;
  lVar5 = strtol((char *)plVar3,(char **)&origImage2,10);
  if (_origImage2 == plVar3) {
    std::__throw_invalid_argument("stoi");
LAB_0010713a:
    std::__throw_out_of_range("stoi");
LAB_00107146:
    std::__throw_invalid_argument("stoi");
LAB_00107152:
    std::__throw_out_of_range("stoi");
  }
  else {
    threshold = (int)lVar5;
    if ((threshold != lVar5) || (pSVar4->width == 0x22)) goto LAB_0010713a;
    if (pSVar4->width == 0) {
      pSVar4->width = iVar1;
    }
    if (_origImage1 != local_388) {
      operator_delete(_origImage1,local_388[0] + 1);
    }
    std::__cxx11::string::string((string *)&origImage1,argv[4],(allocator *)&featurePointsImg);
    plVar3 = _origImage1;
    iVar1 = pSVar4->width;
    pSVar4->width = 0;
    lVar5 = strtol((char *)_origImage1,(char **)&origImage2,10);
    if (_origImage2 == plVar3) goto LAB_00107146;
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (pSVar4->width == 0x22)) goto LAB_00107152;
    if (pSVar4->width == 0) {
      pSVar4->width = iVar1;
    }
    if (_origImage1 != local_388) {
      operator_delete(_origImage1,local_388[0] + 1);
    }
    std::__cxx11::string::string((string *)&origImage1,argv[5],(allocator *)&featurePointsImg);
    plVar3 = _origImage1;
    iVar1 = pSVar4->width;
    pSVar4->width = 0;
    lVar6 = strtol((char *)_origImage1,(char **)&origImage2,10);
    if (_origImage2 != plVar3) {
      if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (pSVar4->width != 0x22)) {
        if (pSVar4->width == 0) {
          pSVar4->width = iVar1;
        }
        if (_origImage1 != local_388) {
          operator_delete(_origImage1,local_388[0] + 1);
        }
        cv::imread((string *)&origImage1,(int)&fileName1);
        featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        harrisCorner(&origImage1,&featurePoints1,threshold,0 < (int)lVar6);
        cv::imread((string *)&origImage2,(int)&fileName2);
        featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        harrisCorner(&origImage2,&featurePoints2,threshold,0 < (int)lVar6);
        cv::Mat::Mat(&featurePointsImg);
        local_3b8.sz.width = 0;
        local_3b8.sz.height = 0;
        local_3b8.flags = 0x1010000;
        local_1e8.sz.width = 0;
        local_1e8.sz.height = 0;
        local_1e8.flags = 0x3010000;
        _out = (long *)0xbff0000000000000;
        local_178[0] = -0x4010000000000000;
        local_178[1] = 0xbff0000000000000;
        local_3b8.obj = &origImage1;
        local_1e8.obj = &featurePointsImg;
        cv::drawKeypoints(&local_3b8,(vector *)&featurePoints1,(_InputOutputArray *)&local_1e8,
                          (Scalar_ *)&out,DEFAULT);
        _out = local_178;
        std::__cxx11::string::_M_construct<char_const*>((string *)&out,"Key Points","");
        local_3b8.sz.width = 0;
        local_3b8.sz.height = 0;
        local_3b8.flags = 0x1010000;
        local_3b8.obj = &featurePointsImg;
        cv::imshow((string *)&out,&local_3b8);
        if (_out != local_178) {
          operator_delete(_out,local_178[0] + 1);
        }
        cv::waitKey(0);
        local_3b8.sz.width = 0;
        local_3b8.sz.height = 0;
        local_3b8.flags = 0x1010000;
        local_1e8.sz.width = 0;
        local_1e8.sz.height = 0;
        local_1e8.flags = 0x3010000;
        _out = (long *)0xbff0000000000000;
        local_178[0] = -0x4010000000000000;
        local_178[1] = 0xbff0000000000000;
        local_3b8.obj = &origImage2;
        local_1e8.obj = &featurePointsImg;
        cv::drawKeypoints(&local_3b8,(vector *)&featurePoints2,(_InputOutputArray *)&local_1e8,
                          (Scalar_ *)&out,DEFAULT);
        _out = local_178;
        std::__cxx11::string::_M_construct<char_const*>((string *)&out,"Key Points","");
        local_3b8.sz.width = 0;
        local_3b8.sz.height = 0;
        local_3b8.flags = 0x1010000;
        local_3b8.obj = &featurePointsImg;
        cv::imshow((string *)&out,&local_3b8);
        if (_out != local_178) {
          operator_delete(_out,local_178[0] + 1);
        }
        cv::waitKey(0);
        keyPointDescriptor1.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        keyPointDescriptor1.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        keyPointDescriptor1.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector(&local_220,&featurePoints1)
        ;
        generateDescriptor(&origImage1,&local_220,&keyPointDescriptor1);
        if (local_220.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_220.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_220.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_220.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        keyPointDescriptor2.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        keyPointDescriptor2.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        keyPointDescriptor2.super__Vector_base<Descriptor,_std::allocator<Descriptor>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector(&local_238,&featurePoints2)
        ;
        generateDescriptor(&origImage2,&local_238,&keyPointDescriptor2);
        if (local_238.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_238.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        findMatch(&keyPointDescriptor1,&keyPointDescriptor2,&keyPoint1,&keyPoint2,&dMatch,(int)lVar5
                 );
        cv::Mat::Mat(&out);
        local_2f8.sz.width = 0;
        local_2f8.sz.height = 0;
        local_2f8.flags = 0x1010000;
        local_48.sz.width = 0;
        local_48.sz.height = 0;
        local_48.flags = 0x1010000;
        local_60.super__OutputArray.super__InputArray.sz.width = 0;
        local_60.super__OutputArray.super__InputArray.sz.height = 0;
        local_60.super__OutputArray.super__InputArray.flags = 0x3010000;
        local_3b8._0_8_ = (Size *)0xbff0000000000000;
        local_3b8.obj = (void *)0xbff0000000000000;
        local_3b8.sz.width = 0;
        local_3b8.sz.height = -0x40100000;
        uStack_3a0 = 0xbff0000000000000;
        local_1e8.flags = 0;
        local_1e8._4_4_ = 0xbff00000;
        local_1e8.obj = (void *)0xbff0000000000000;
        local_1e8.sz.width = 0;
        local_1e8.sz.height = -0x40100000;
        uStack_1d0 = 0xbff0000000000000;
        local_1f8 = 0;
        local_208 = (void *)0x0;
        uStack_200 = 0;
        local_2f8.obj = &origImage1;
        local_60.super__OutputArray.super__InputArray.obj = (string *)&out;
        local_48.obj = &origImage2;
        cv::drawMatches(&local_2f8,(vector *)&keyPoint1,&local_48,(vector *)&keyPoint2,
                        (vector *)&dMatch,&local_60,(Scalar_ *)&local_3b8,(Scalar_ *)&local_1e8,
                        (vector *)&local_208,DEFAULT);
        if (local_208 != (void *)0x0) {
          operator_delete(local_208,local_1f8 - (long)local_208);
        }
        ppSVar2 = (Size **)&local_3b8.sz;
        local_3b8._0_8_ = ppSVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"Match","");
        local_1e8.sz.width = 0;
        local_1e8.sz.height = 0;
        local_1e8.flags = 0x1010000;
        local_1e8.obj = (string *)&out;
        cv::imshow((string *)&local_3b8,&local_1e8);
        if ((Size **)local_3b8._0_8_ != ppSVar2) {
          operator_delete((void *)local_3b8._0_8_,(long)local_3b8.sz + 1);
        }
        cv::waitKey(0);
        local_3b8._0_8_ = ppSVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"screenshot.png","");
        local_1e8.sz.width = 0;
        local_1e8.sz.height = 0;
        local_1e8.flags = 0x1010000;
        local_2f8.sz.width = 0;
        local_2f8.sz.height = 0;
        local_2f8._0_8_ = (void *)0x0;
        local_2f8.obj = (void *)0x0;
        local_1e8.obj = (string *)&out;
        cv::imwrite((string *)&local_3b8,&local_1e8,(vector *)&local_2f8);
        if ((void *)local_2f8._0_8_ != (void *)0x0) {
          operator_delete((void *)local_2f8._0_8_,(long)local_2f8.sz - local_2f8._0_8_);
        }
        if ((Size **)local_3b8._0_8_ != ppSVar2) {
          operator_delete((void *)local_3b8._0_8_,(long)local_3b8.sz + 1);
        }
        cv::Mat::~Mat(&out);
        if (dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)keyPoint2.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)keyPoint2.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)keyPoint1.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)keyPoint1.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<Descriptor,_std::allocator<Descriptor>_>::~vector(&keyPointDescriptor2);
        std::vector<Descriptor,_std::allocator<Descriptor>_>::~vector(&keyPointDescriptor1);
        cv::Mat::~Mat(&featurePointsImg);
        if (featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(featurePoints2.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)featurePoints2.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)featurePoints2.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        cv::Mat::~Mat(&origImage2);
        if (featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(featurePoints1.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)featurePoints1.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)featurePoints1.
                                super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        cv::Mat::~Mat(&origImage1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fileName2._M_dataplus._M_p != &fileName2.field_2) {
          operator_delete(fileName2._M_dataplus._M_p,fileName2.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fileName1._M_dataplus._M_p != &fileName1.field_2) {
          operator_delete(fileName1._M_dataplus._M_p,fileName1.field_2._M_allocated_capacity + 1);
        }
        return 0;
      }
      goto LAB_0010716a;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0010716a:
  uVar7 = std::__throw_out_of_range("stoi");
  if ((void *)local_2f8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_2f8._0_8_,(long)local_2f8.sz - local_2f8._0_8_);
  }
  if ((Size *)local_3b8._0_8_ != pSVar4) {
    operator_delete((void *)local_3b8._0_8_,(long)local_3b8.sz + 1);
  }
  cv::Mat::~Mat(&out);
  if (dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)dMatch.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)keyPoint2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)keyPoint1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Descriptor,_std::allocator<Descriptor>_>::~vector(&keyPointDescriptor2);
  std::vector<Descriptor,_std::allocator<Descriptor>_>::~vector(&keyPointDescriptor1);
  cv::Mat::~Mat(&featurePointsImg);
  if (featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(featurePoints2.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)featurePoints2.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)featurePoints2.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(&origImage2);
  if (featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(featurePoints1.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)featurePoints1.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)featurePoints1.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(&origImage1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileName2._M_dataplus._M_p != &fileName2.field_2) {
    operator_delete(fileName2._M_dataplus._M_p,fileName2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileName1._M_dataplus._M_p != &fileName1.field_2) {
    operator_delete(fileName1._M_dataplus._M_p,fileName1.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

int main(int argc, char* argv[]) {

	String fileName1 = argv[1];
	String fileName2 = argv[2];
	int thresholdFeature = stoi(argv[3]);
	int thresholdMatch = stoi(argv[4]);
	int useANMS = stoi(argv[5]);
	bool isANMS = (useANMS > 0) ? true : false;

	Mat origImage1 = imread(fileName1);
	vector<KeyPoint> featurePoints1;
	harrisCorner(origImage1, featurePoints1, thresholdFeature,isANMS);

	Mat origImage2 = imread(fileName2);
	vector<KeyPoint> featurePoints2;
	harrisCorner(origImage2, featurePoints2, thresholdFeature,isANMS);

	Mat featurePointsImg;
	drawKeypoints(origImage1, featurePoints1, featurePointsImg);
	imshow("Key Points", featurePointsImg);
	waitKey();

	drawKeypoints(origImage2, featurePoints2, featurePointsImg);
	imshow("Key Points", featurePointsImg);
	waitKey();

	vector<Descriptor> keyPointDescriptor1;
	generateDescriptor(origImage1, featurePoints1, keyPointDescriptor1);

	vector<Descriptor> keyPointDescriptor2;
	generateDescriptor(origImage2, featurePoints2, keyPointDescriptor2);

	vector<KeyPoint> keyPoint1;
	vector<KeyPoint> keyPoint2;
	vector<DMatch> dMatch;
	findMatch(keyPointDescriptor1, keyPointDescriptor2, keyPoint1, keyPoint2, dMatch, thresholdMatch);

	Mat out;
	drawMatches(origImage1, keyPoint1, origImage2, keyPoint2, dMatch,out);
	imshow("Match", out);
	waitKey();
	imwrite("screenshot.png", out);

}